

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteCordOutline
          (EpsCopyOutputStream *this,Cord *c,uint8_t *ptr)

{
  size_t sVar1;
  uint8_t *puVar2;
  
  sVar1 = absl::lts_20250127::Cord::InlineRep::size(&c->contents_);
  while( true ) {
    if ((uint)sVar1 < 0x80) break;
    *ptr = (byte)sVar1 | 0x80;
    sVar1 = (size_t)((uint)sVar1 >> 7);
    ptr = ptr + 1;
  }
  *ptr = (byte)sVar1;
  puVar2 = WriteCord(this,c,ptr + 1);
  return puVar2;
}

Assistant:

uint8_t* EpsCopyOutputStream::WriteCordOutline(const absl::Cord& c, uint8_t* ptr) {
  uint32_t size = c.size();
  ptr = UnsafeWriteSize(size, ptr);
  return WriteCord(c, ptr);
}